

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

int Fra_Clau(Aig_Man_t *pMan,int nIters,int fVerbose,int fVeryVerbose)

{
  sat_solver *psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Cla_Man_t *p_00;
  int *piVar6;
  int *piVar7;
  uint local_40;
  int i;
  int fFailed;
  int RetValue;
  int Iter;
  Cla_Man_t *p;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nIters_local;
  Aig_Man_t *pMan_local;
  
  iVar3 = Aig_ManCoNum(pMan);
  iVar4 = Aig_ManRegNum(pMan);
  if (iVar3 - iVar4 != 1) {
    __assert_fail("Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                  ,0x281,"int Fra_Clau(Aig_Man_t *, int, int, int)");
  }
  p_00 = Fra_ClauStart(pMan);
  if (p_00 == (Cla_Man_t *)0x0) {
    printf("The property is trivially inductive.\n");
    pMan_local._4_4_ = 1;
  }
  else {
    for (fFailed = 0; iVar3 = Fra_ClauCheckProperty(p_00,p_00->vCexMain0),
        iVar3 == 0 && fFailed < nIters; fFailed = fFailed + 1) {
      if (fVerbose != 0) {
        printf("%4d : ",(ulong)(uint)fFailed);
      }
      Fra_ClauRemapClause(p_00->pMapCsMainToCsTest,p_00->vCexMain0,p_00->vCexMain,0);
      if ((fVerbose != 0) && (fVeryVerbose != 0)) {
        Fra_ClauPrintClause(p_00->vSatVarsTestCs,p_00->vCexMain);
      }
      bVar2 = false;
      local_40 = 0;
      while (iVar3 = Fra_ClauCheckClause(p_00,p_00->vCexMain,p_00->vCexTest), iVar3 == 0) {
        Fra_ClauReduceClause(p_00->vCexMain,p_00->vCexTest);
        Fra_ClauRemapClause(p_00->pMapCsTestToNsBmc,p_00->vCexMain,p_00->vCexBmc,0);
        iVar3 = Vec_IntSize(p_00->vCexMain);
        if (iVar3 < 1) {
          Vec_IntComplement(p_00->vCexMain0);
          psVar1 = p_00->pSatMain;
          piVar6 = Vec_IntArray(p_00->vCexMain0);
          piVar7 = Vec_IntArray(p_00->vCexMain0);
          iVar3 = Vec_IntSize(p_00->vCexMain0);
          iVar3 = sat_solver_addclause(psVar1,piVar6,piVar7 + iVar3);
          if (iVar3 == 0) {
            printf("\nProperty is proved after %d iterations.\n",(ulong)(fFailed + 1));
            return 0;
          }
          bVar2 = true;
          break;
        }
        local_40 = local_40 + 1;
      }
      if (bVar2) {
        if (fVerbose != 0) {
          printf(" Reducing failed after %d iterations (BMC failed).\n",(ulong)local_40);
        }
      }
      else {
        iVar3 = Vec_IntSize(p_00->vCexMain);
        if (iVar3 == 0) {
          if (fVerbose != 0) {
            printf(" Reducing failed after %d iterations (nothing left).\n",(ulong)local_40);
          }
        }
        else {
          if ((fVerbose != 0) && (printf("  "), fVeryVerbose != 0)) {
            Fra_ClauPrintClause(p_00->vSatVarsTestCs,p_00->vCexMain);
          }
          if (fVerbose != 0) {
            uVar5 = Vec_IntSize(p_00->vCexMain);
            printf(" LitsInd = %3d.  ",(ulong)uVar5);
          }
          Vec_IntClear(p_00->vCexBase);
          iVar3 = Vec_IntSize(p_00->vCexMain);
          if (1 < iVar3) {
            Fra_ClauMinimizeClause(p_00,p_00->vCexBase,p_00->vCexMain);
          }
          iVar3 = Vec_IntSize(p_00->vCexMain);
          if (iVar3 < 1) {
            __assert_fail("Vec_IntSize(p->vCexMain) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                          ,0x2c0,"int Fra_Clau(Aig_Man_t *, int, int, int)");
          }
          if ((fVerbose != 0) && (fVeryVerbose != 0)) {
            Fra_ClauPrintClause(p_00->vSatVarsTestCs,p_00->vCexMain);
          }
          if (fVerbose != 0) {
            uVar5 = Vec_IntSize(p_00->vCexMain);
            printf(" LitsRed = %3d.  ",(ulong)uVar5);
            printf("\n");
          }
          Fra_ClauRemapClause(p_00->pMapCsTestToCsMain,p_00->vCexMain,p_00->vCexAssm,1);
          psVar1 = p_00->pSatMain;
          piVar6 = Vec_IntArray(p_00->vCexAssm);
          piVar7 = Vec_IntArray(p_00->vCexAssm);
          iVar3 = Vec_IntSize(p_00->vCexAssm);
          iVar3 = sat_solver_addclause(psVar1,piVar6,piVar7 + iVar3);
          if (iVar3 == 0) {
            fFailed = fFailed + 1;
            break;
          }
          if (p_00->pSatMain->qtail != p_00->pSatMain->qhead) {
            iVar3 = sat_solver_simplify(p_00->pSatMain);
            if (iVar3 == 0) {
              __assert_fail("RetValue != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                            ,0x2d2,"int Fra_Clau(Aig_Man_t *, int, int, int)");
            }
            if (p_00->pSatMain->qtail != p_00->pSatMain->qhead) {
              __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                            ,0x2d3,"int Fra_Clau(Aig_Man_t *, int, int, int)");
            }
          }
        }
      }
    }
    if (fFailed == nIters) {
      printf("Property is not proved after %d iterations.\n",(ulong)(uint)nIters);
      pMan_local._4_4_ = 0;
    }
    else {
      printf("Property is proved after %d iterations.\n",(ulong)(uint)fFailed);
      Fra_ClauStop(p_00);
      pMan_local._4_4_ = 1;
    }
  }
  return pMan_local._4_4_;
}

Assistant:

int Fra_Clau( Aig_Man_t * pMan, int nIters, int fVerbose, int fVeryVerbose )
{
    Cla_Man_t * p;
    int Iter, RetValue, fFailed, i;
    assert( Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) == 1 );
    // create the manager
    p = Fra_ClauStart( pMan );
    if ( p == NULL )
    {
        printf( "The property is trivially inductive.\n" );
        return 1;
    }
    // generate counter-examples and expand them
    for ( Iter = 0; !Fra_ClauCheckProperty( p, p->vCexMain0 ) && Iter < nIters; Iter++ )
    {
        if ( fVerbose )
            printf( "%4d : ", Iter );
        // remap clause into the test manager
        Fra_ClauRemapClause( p->pMapCsMainToCsTest, p->vCexMain0, p->vCexMain, 0 );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        // the main counter-example is in p->vCexMain
        // intermediate counter-examples are in p->vCexTest
        // generate the reduced counter-example to the inductive property
        fFailed = 0;
        for ( i = 0; !Fra_ClauCheckClause( p, p->vCexMain, p->vCexTest ); i++ )
        {
            Fra_ClauReduceClause( p->vCexMain, p->vCexTest );
            Fra_ClauRemapClause( p->pMapCsTestToNsBmc, p->vCexMain, p->vCexBmc, 0 );

//            if ( !Fra_ClauCheckBmc(p, p->vCexBmc) )
            if ( Vec_IntSize(p->vCexMain) < 1 )
            {
                Vec_IntComplement( p->vCexMain0 ); 
                RetValue = sat_solver_addclause( p->pSatMain, Vec_IntArray(p->vCexMain0), Vec_IntArray(p->vCexMain0) + Vec_IntSize(p->vCexMain0) );
                if ( RetValue == 0 )
                {
                    printf( "\nProperty is proved after %d iterations.\n", Iter+1 );
                    return 0;
                }
                fFailed = 1;
                break;
            }
        }
        if ( fFailed )
        {
            if ( fVerbose )
                printf( " Reducing failed after %d iterations (BMC failed).\n", i );
            continue;
        }
        if ( Vec_IntSize(p->vCexMain) == 0 )
        {
            if ( fVerbose )
                printf( " Reducing failed after %d iterations (nothing left).\n", i );
            continue;
        }
        if ( fVerbose )
            printf( "  " );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        if ( fVerbose )
            printf( " LitsInd = %3d.  ", Vec_IntSize(p->vCexMain) );
        // minimize the inductive property
        Vec_IntClear( p->vCexBase );
        if ( Vec_IntSize(p->vCexMain) > 1 )
//        Fra_ClauMinimizeClause_rec( p, p->vCexBase, p->vCexMain );
            Fra_ClauMinimizeClause( p, p->vCexBase, p->vCexMain );
        assert( Vec_IntSize(p->vCexMain) > 0 );
        if ( fVerbose && fVeryVerbose )
            Fra_ClauPrintClause( p->vSatVarsTestCs, p->vCexMain );
        if ( fVerbose )
            printf( " LitsRed = %3d.  ", Vec_IntSize(p->vCexMain) );
        if ( fVerbose )
            printf( "\n" );
        // add the clause to the solver
        Fra_ClauRemapClause( p->pMapCsTestToCsMain, p->vCexMain, p->vCexAssm, 1 );
        RetValue = sat_solver_addclause( p->pSatMain, Vec_IntArray(p->vCexAssm), Vec_IntArray(p->vCexAssm) + Vec_IntSize(p->vCexAssm) );
        if ( RetValue == 0 )
        {
            Iter++;
            break;
        }
        if ( p->pSatMain->qtail != p->pSatMain->qhead )
        {
            RetValue = sat_solver_simplify(p->pSatMain);
            assert( RetValue != 0 );
            assert( p->pSatMain->qtail == p->pSatMain->qhead );
        }
    }

    // report the results
    if ( Iter == nIters )
    {
        printf( "Property is not proved after %d iterations.\n", nIters );
        return 0;
    }
    printf( "Property is proved after %d iterations.\n", Iter );
    Fra_ClauStop( p );
    return 1;
}